

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O0

void * udbg_knownIssue_openU
                 (void *ptr,char *ticket,char *where,UChar *msg,UBool *firstForTicket,
                 UBool *firstForWhere)

{
  undefined8 local_40;
  KnownIssues *t;
  UBool *firstForWhere_local;
  UBool *firstForTicket_local;
  UChar *msg_local;
  char *where_local;
  char *ticket_local;
  void *ptr_local;
  
  local_40 = (KnownIssues *)ptr;
  if (ptr == (void *)0x0) {
    local_40 = (KnownIssues *)operator_new(0x30);
    KnownIssues::KnownIssues(local_40);
  }
  KnownIssues::add(local_40,ticket,where,msg,firstForTicket,firstForWhere);
  return local_40;
}

Assistant:

U_CAPI void *udbg_knownIssue_openU(void *ptr, const char *ticket, char *where, const UChar *msg, UBool *firstForTicket,
                                   UBool *firstForWhere) {
  KnownIssues *t = static_cast<KnownIssues*>(ptr);
  if(t==NULL) {
    t = new KnownIssues();
  }

  t->add(ticket, where, msg, firstForTicket, firstForWhere);

  return static_cast<void*>(t);
}